

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_recv(nghttp2_session *session)

{
  size_t inlen;
  size_t sVar1;
  ssize_t proclen;
  ssize_t readlen;
  uint8_t buf [16384];
  nghttp2_session *session_local;
  
  buf._16376_8_ = session;
  do {
    while (inlen = session_recv((nghttp2_session *)buf._16376_8_,(uint8_t *)&readlen,0x4000),
          0 < (long)inlen) {
      sVar1 = nghttp2_session_mem_recv((nghttp2_session *)buf._16376_8_,(uint8_t *)&readlen,inlen);
      if ((long)sVar1 < 0) {
        return (int)sVar1;
      }
      if (sVar1 != inlen) {
        __assert_fail("proclen == readlen",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                      ,0x1cc7,"int nghttp2_session_recv(nghttp2_session *)");
      }
    }
    if ((inlen == 0) || (inlen == 0xfffffffffffffe08)) {
      return 0;
    }
    if (inlen == 0xfffffffffffffe05) {
      return -0x1fb;
    }
  } while (-1 < (long)inlen);
  return -0x386;
}

Assistant:

int nghttp2_session_recv(nghttp2_session *session) {
  uint8_t buf[NGHTTP2_INBOUND_BUFFER_LENGTH];
  while (1) {
    ssize_t readlen;
    readlen = session_recv(session, buf, sizeof(buf));
    if (readlen > 0) {
      ssize_t proclen = nghttp2_session_mem_recv(session, buf, (size_t)readlen);
      if (proclen < 0) {
        return (int)proclen;
      }
      assert(proclen == readlen);
    } else if (readlen == 0 || readlen == NGHTTP2_ERR_WOULDBLOCK) {
      return 0;
    } else if (readlen == NGHTTP2_ERR_EOF) {
      return NGHTTP2_ERR_EOF;
    } else if (readlen < 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
  }
}